

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O3

ags_t AGSSockAPI::AGSEnumerateError(int errnum)

{
  ulong uVar1;
  
  switch(errnum) {
  case 0x47:
  case 0x5d:
  case 0x5e:
  case 0x5f:
    return 8;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x5a:
  case 0x5c:
  case 0x60:
  case 0x6d:
  case 0x70:
    goto switchD_001041b4_caseD_48;
  case 0x58:
switchD_001041b4_caseD_58:
    return 5;
  case 0x59:
  case 0x5b:
  case 0x6a:
switchD_001041b4_caseD_59:
    return 7;
  case 0x61:
  case 0x62:
  case 99:
    return 3;
  case 100:
  case 0x65:
    return 0xb;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6f:
    return 6;
  case 0x69:
switchD_001041b4_caseD_69:
    return 10;
  case 0x6b:
  case 0x6c:
  case 0x6e:
    return 0xc;
  case 0x71:
    return 9;
  case 0x72:
  case 0x73:
switchD_001041b4_caseD_72:
    return 4;
  default:
    if ((uint)errnum < 0x19) {
      uVar1 = (ulong)(uint)errnum;
      switch(uVar1) {
      case 0:
        goto switchD_001041d1_caseD_0;
      case 1:
      case 0xd:
        return 2;
      case 4:
      case 0xb:
        goto switchD_001041b4_caseD_72;
      case 9:
        goto switchD_001041b4_caseD_58;
      case 0xc:
      case 0x17:
      case 0x18:
        goto switchD_001041b4_caseD_69;
      case 0xe:
      case 0x16:
        goto switchD_001041b4_caseD_59;
      }
    }
    else if (errnum == 0x20) {
      return 0xc;
    }
switchD_001041b4_caseD_48:
    uVar1 = 1;
switchD_001041d1_caseD_0:
    return uVar1;
  }
}

Assistant:

ags_t AGSEnumerateError(int errnum)
{
	switch (errnum)
	{
		case 0:
		                          return AGSSOCK_NO_ERROR;
		case ERR(ACCES):
		NOT_WIN(case ERR(PERM):)
		                          return AGSSOCK_ACCESS_DENIED;
		case ERR(ADDRINUSE):
		case ERR(ADDRNOTAVAIL):
		case ERR(AFNOSUPPORT):
		                          return AGSSOCK_ADDRESS_NOT_AVAILABLE;
#ifndef _WIN32
	#if EAGAIN != EWOULDBLOCK
		case EAGAIN:
	#endif
#endif
		case ERR(WOULDBLOCK):
		case ERR(ALREADY):
		case ERR(INPROGRESS):
		case ERR(INTR):
		                          return AGSSOCK_PLEASE_TRY_AGAIN;
		case ERR(BADF):
		case ERR(NOTSOCK):
		                          return AGSSOCK_SOCKET_NOT_VALID;
		case ERR(CONNABORTED):
		case ERR(CONNREFUSED):
		case ERR(CONNRESET):
		case ERR(NETRESET):
		                          return AGSSOCK_DISCONNECTED;
		case ERR(DESTADDRREQ):
		case ERR(INVAL):
		case ERR(PROTOTYPE):
		case ERR(FAULT):
		case ERR(ISCONN):
		                          return AGSSOCK_INVALID;
		case ERR(OPNOTSUPP):
		NOT_WIN(case ERR(PROTO):)
		case ERR(PROTONOSUPPORT):
		case ERR(SOCKTNOSUPPORT):
		                          return AGSSOCK_UNSUPPORTED;
		case ERR(HOSTUNREACH):
		                          return AGSSOCK_HOST_NOT_REACHED;
		case ERR(MFILE):
		NOT_WIN(case ERR(NFILE):)
		case ERR(NOBUFS):
		NOT_WIN(case ERR(NOMEM):)
		                          return AGSSOCK_NOT_ENOUGH_RESOURCES;
		case ERR(NETDOWN):
		case ERR(NETUNREACH):
		                          return AGSSOCK_NETWORK_NOT_AVAILABLE;
		case ERR(NOTCONN):
		NOT_WIN(case ERR(PIPE):)
		case ERR(SHUTDOWN):
		case ERR(TIMEDOUT):
		                          return AGSSOCK_NOT_CONNECTED;
		default:
		                          return AGSSOCK_OTHER_ERROR;
	}
}